

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ImGuiTableColumn *pIVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ImGuiTableColumn *p;
  ImGuiTableColumn *pIVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  
  uVar2 = table->Flags;
  if ((uVar2 & 8) == 0) {
    __assert_fail("table->Flags & ImGuiTableFlags_Sortable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x9f3,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
  }
  uVar3 = table->ColumnsCount;
  lVar8 = (long)(int)uVar3;
  if (lVar8 < 1) {
    iVar6 = 0;
    lVar8 = 1;
  }
  else {
    pIVar10 = (table->Columns).Data;
    iVar6 = 0;
    uVar9 = 0;
    do {
      if ((table->Columns).DataEnd <= pIVar10) goto LAB_0019425c;
      if ((pIVar10->SortOrder != -1) && (pIVar10->IsEnabled == false)) {
        pIVar10->SortOrder = -1;
      }
      if ((long)pIVar10->SortOrder != 0xffffffffffffffff) {
        if (0x3e < iVar6) {
          __assert_fail("sort_order_count < (int)sizeof(sort_order_mask) * 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                        ,0xa01,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
        }
        iVar6 = iVar6 + 1;
        uVar9 = uVar9 | 1L << ((long)pIVar10->SortOrder & 0x3fU);
      }
      pIVar10 = pIVar10 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    lVar8 = uVar9 + 1;
  }
  bVar5 = 1 < iVar6;
  bVar15 = (uVar2 >> 0x19 & 1) == 0;
  if (0 < iVar6 && (bVar15 && bVar5 || 1L << ((byte)iVar6 & 0x3f) != lVar8)) {
    iVar11 = 0;
    uVar9 = 0;
    do {
      uVar14 = 0xffffffff;
      if (0 < (int)uVar3) {
        lVar8 = 0x56;
        uVar12 = 0;
        do {
          if ((uVar9 >> (uVar12 & 0x3f) & 1) == 0) {
            pIVar10 = (table->Columns).Data;
            pIVar4 = (table->Columns).DataEnd;
            if (pIVar4 <= (ImGuiTableColumn *)((long)pIVar10 + lVar8 + -0x56)) goto LAB_0019425c;
            cVar1 = *(char *)((long)&pIVar10->Flags + lVar8);
            if (cVar1 != -1) {
              iVar13 = (int)uVar14;
              if (iVar13 != -1) {
                if (iVar13 < 0) goto LAB_0019425c;
                if (pIVar4 <= pIVar10 + iVar13) goto LAB_0019425c;
                if (pIVar10[iVar13].SortOrder <= cVar1) goto LAB_00194134;
              }
              uVar14 = uVar12 & 0xffffffff;
            }
          }
LAB_00194134:
          uVar12 = uVar12 + 1;
          lVar8 = lVar8 + 0x68;
        } while (uVar3 != uVar12);
      }
      iVar13 = (int)uVar14;
      if (iVar13 == -1) {
        __assert_fail("column_with_smallest_sort_order != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                      ,0xa12,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
      }
      if (iVar13 < 0) goto LAB_0019425c;
      pIVar10 = (table->Columns).Data;
      if ((table->Columns).DataEnd <= pIVar10 + iVar13) goto LAB_0019425c;
      pIVar10[iVar13].SortOrder = (ImGuiTableColumnIdx)iVar11;
      if (bVar15 && bVar5) {
        iVar6 = 1;
      }
      if (0 < (int)uVar3 && (bVar15 && bVar5)) {
        lVar8 = 0;
        do {
          if (uVar14 * 0x68 - lVar8 != 0) {
            if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar10->Flags + lVar8))
            goto LAB_0019425c;
            (&pIVar10->SortOrder)[lVar8] = -1;
          }
          lVar8 = lVar8 + 0x68;
        } while ((ulong)uVar3 * 0x68 - lVar8 != 0);
        iVar6 = 1;
      }
      uVar9 = uVar9 | 1L << (uVar14 & 0x3f);
      iVar11 = iVar11 + 1;
    } while (iVar11 < iVar6 && (!bVar15 || !bVar5));
  }
  if (((iVar6 == 0) && (iVar6 = 0, (uVar2 >> 0x1a & 1) == 0)) && (0 < table->ColumnsCount)) {
    lVar8 = 0;
    lVar7 = 0;
    iVar6 = 0;
    do {
      pIVar4 = (table->Columns).Data;
      pIVar10 = (ImGuiTableColumn *)((long)&pIVar4->Flags + lVar8);
      if ((table->Columns).DataEnd <= pIVar10) {
LAB_0019425c:
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                      ,0x20c,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
      }
      bVar5 = true;
      if (((&pIVar4->IsEnabled)[lVar8] == true) && ((pIVar10->Flags & 0x200) == 0)) {
        (&pIVar4->SortOrder)[lVar8] = '\0';
        if (((&pIVar4->field_0x64)[lVar8] & 0xc) == 0) {
          __assert_fail("n < column->SortDirectionsAvailCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                        ,0x9b1,
                        "ImGuiSortDirection TableGetColumnAvailSortDirection(ImGuiTableColumn *, int)"
                       );
        }
        (&pIVar4->field_0x64)[lVar8] =
             (&pIVar4->field_0x64)[lVar8] & 0xfc | (&pIVar4->SortDirectionsAvailList)[lVar8] & 3;
        iVar6 = 1;
        bVar5 = false;
      }
      if (!bVar5) break;
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x68;
    } while (lVar7 < table->ColumnsCount);
  }
  table->SortSpecsCount = (ImGuiTableColumnIdx)iVar6;
  return;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}